

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void __thiscall rw::HAnimHierarchy::updateMatrices(HAnimHierarchy *this)

{
  undefined8 *puVar1;
  uint uVar2;
  AnimInterpolator *pAVar3;
  Frame *this_00;
  Matrix *pMVar4;
  int32 *piVar5;
  undefined8 *puVar6;
  Matrix *dst;
  int iVar7;
  Matrix rootMat;
  Matrix animMat;
  Matrix *stack [64];
  Matrix local_2b8;
  Matrix local_278;
  Matrix *local_238;
  undefined8 local_230 [64];
  
  pAVar3 = this->interpolator;
  dst = this->matrices;
  if (((this->parentFrame == (Frame *)0x0) ||
      (this_00 = (Frame *)(this->parentFrame->object).parent, this_00 == (Frame *)0x0)) ||
     ((this->flags & 0x4000) != 0)) {
    Matrix::setIdentity(&local_2b8);
  }
  else {
    pMVar4 = Frame::getLTM(this_00);
    local_2b8.right.x = (pMVar4->right).x;
    local_2b8.right.y = (pMVar4->right).y;
    local_2b8._8_8_ = *(undefined8 *)&(pMVar4->right).z;
    local_2b8.up.x = (pMVar4->up).x;
    local_2b8.up.y = (pMVar4->up).y;
    local_2b8._24_8_ = *(undefined8 *)&(pMVar4->up).z;
    local_2b8.at.x = (pMVar4->at).x;
    local_2b8.at.y = (pMVar4->at).y;
    local_2b8._40_8_ = *(undefined8 *)&(pMVar4->at).z;
    local_2b8.pos.x = (pMVar4->pos).x;
    local_2b8.pos.y = (pMVar4->pos).y;
    local_2b8._56_8_ = *(undefined8 *)&(pMVar4->pos).z;
  }
  puVar6 = local_230;
  pMVar4 = &local_2b8;
  piVar5 = &this->nodeInfo->flags;
  local_238 = pMVar4;
  for (iVar7 = 0; iVar7 < this->numNodes; iVar7 = iVar7 + 1) {
    (*pAVar3->applyCB)(&local_278,
                       (Animation **)
                       ((long)&pAVar3[1].currentAnim +
                       (long)iVar7 * (long)pAVar3->currentInterpKeyFrameSize));
    Matrix::mult(dst,&local_278,pMVar4);
    uVar2 = *piVar5;
    if ((uVar2 & 2) != 0) {
      *puVar6 = pMVar4;
      puVar6 = puVar6 + 1;
    }
    pMVar4 = dst;
    if ((uVar2 & 1) != 0) {
      puVar1 = puVar6 + -1;
      puVar6 = puVar6 + -1;
      pMVar4 = (Matrix *)*puVar1;
    }
    dst = dst + 1;
    piVar5 = piVar5 + 6;
  }
  return;
}

Assistant:

void
HAnimHierarchy::updateMatrices(void)
{
	// TODO: handle more (all!) cases

	Matrix rootMat, animMat;
	Matrix *curMat, *parentMat;
	Matrix **sp, *stack[64];
	Frame *frm, *parfrm;
	int32 i;
	AnimInterpolator *anim = this->interpolator;

	sp = stack;
	curMat = this->matrices;

	frm = this->parentFrame;
	if(frm && (parfrm = frm->getParent()) && !(this->flags&LOCALSPACEMATRICES))
		rootMat = *parfrm->getLTM();
	else
		rootMat.setIdentity();
	parentMat = &rootMat;
	*sp++ = parentMat;
	HAnimNodeInfo *node = this->nodeInfo;
	for(i = 0; i < this->numNodes; i++){
		anim->applyCB(&animMat, anim->getInterpFrame(i));

		// TODO: here we could update local matrices

		Matrix::mult(curMat, &animMat, parentMat);

		// TODO: here we could update LTM

		if(node->flags & PUSH)
			*sp++ = parentMat;
		parentMat = curMat;
		if(node->flags & POP)
			parentMat = *--sp;
		assert(sp >= stack);
		assert(sp <= &stack[64]);

		node++;
		curMat++;
	}
}